

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::JSONParser::ParseExpectedValues
          (JSONParser *this,
          vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_> *out_values)

{
  bool bVar1;
  bool bVar2;
  Result RVar3;
  undefined1 local_60 [8];
  ExpectedValue value;
  bool first;
  vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_> *out_values_local;
  JSONParser *this_local;
  
  std::vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>::clear(out_values);
  RVar3 = Expect(this,"[");
  bVar1 = wabt::Failed(RVar3);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = true;
    while (bVar2 = Match(this,"]"), ((bVar2 ^ 0xffU) & 1) != 0) {
      if (!bVar1) {
        value.nan[3] = (ExpectedNan)Expect(this,",");
        bVar1 = wabt::Failed((Result)value.nan[3]);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
      }
      ExpectedValue::ExpectedValue((ExpectedValue *)local_60);
      RVar3 = ParseExpectedValue(this,(ExpectedValue *)local_60,Yes);
      bVar1 = wabt::Failed(RVar3);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      std::vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>::push_back
                (out_values,(value_type *)local_60);
      bVar1 = false;
    }
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseExpectedValues(
    std::vector<ExpectedValue>* out_values) {
  out_values->clear();
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    if (!first) {
      EXPECT(",");
    }
    ExpectedValue value;
    CHECK_RESULT(ParseExpectedValue(&value, AllowExpected::Yes));
    out_values->push_back(value);
    first = false;
  }
  return wabt::Result::Ok;
}